

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterRenameTable(Parse *pParse,SrcList *pSrc,Token *pName)

{
  int iVar1;
  sqlite3 *db_00;
  char *zIn;
  int iDb_00;
  int iVar2;
  Table *pTable;
  Table *pTVar3;
  Index *pIVar4;
  Vdbe *p_00;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  Table *pFrom;
  FKey *p;
  int i;
  int savedDbFlags;
  VTable *pVTab;
  char *zWhere;
  Vdbe *v;
  char *zTabName;
  int nTabName;
  sqlite3 *db;
  char *zName;
  Table *pTab;
  char *zDb;
  int iDb;
  Token *pName_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db = (sqlite3 *)0x0;
  db_00 = pParse->db;
  _i = (VTable *)0x0;
  iVar1 = db_00->flags;
  if ((db_00->mallocFailed == '\0') &&
     (pTable = sqlite3LocateTableItem(pParse,0,pSrc->a), pTable != (Table *)0x0)) {
    iDb_00 = sqlite3SchemaToIndex(pParse->db,pTable->pSchema);
    pcVar6 = db_00->aDb[iDb_00].zName;
    db_00->flags = db_00->flags | 0x100000;
    db = (sqlite3 *)sqlite3NameFromToken(db_00,pName);
    if (db != (sqlite3 *)0x0) {
      pTVar3 = sqlite3FindTable(db_00,(char *)db,pcVar6);
      if ((pTVar3 == (Table *)0x0) &&
         (pIVar4 = sqlite3FindIndex(db_00,(char *)db,pcVar6), pIVar4 == (Index *)0x0)) {
        iVar2 = isSystemTable(pParse,pTable->zName);
        if ((iVar2 == 0) && (iVar2 = sqlite3CheckObjectName(pParse,(char *)db), iVar2 == 0)) {
          if (pTable->pSelect == (Select *)0x0) {
            iVar2 = sqlite3AuthCheck(pParse,0x1a,pcVar6,pTable->zName,(char *)0x0);
            if ((iVar2 == 0) && (iVar2 = sqlite3ViewGetColumnNames(pParse,pTable), iVar2 == 0)) {
              if (((pTable->tabFlags & 0x10) != 0) &&
                 (_i = sqlite3GetVTable(db_00,pTable),
                 _i->pVtab->pModule->xRename == (_func_int_sqlite3_vtab_ptr_char_ptr *)0x0)) {
                _i = (VTable *)0x0;
              }
              p_00 = sqlite3GetVdbe(pParse);
              if (p_00 != (Vdbe *)0x0) {
                sqlite3BeginWriteOperation(pParse,(uint)(_i != (VTable *)0x0),iDb_00);
                sqlite3ChangeCookie(pParse,iDb_00);
                if (_i != (VTable *)0x0) {
                  iVar2 = pParse->nMem + 1;
                  pParse->nMem = iVar2;
                  sqlite3VdbeAddOp4(p_00,0x5e,0,iVar2,0,(char *)db,0);
                  sqlite3VdbeAddOp4(p_00,0x8b,iVar2,0,0,(char *)_i,-10);
                  sqlite3MayAbort(pParse);
                }
                zIn = pTable->zName;
                iVar2 = sqlite3Utf8CharLen(zIn,-1);
                if (((db_00->flags & 0x40000U) != 0) &&
                   (pcVar5 = whereForeignKeys(pParse,pTable), pcVar5 != (char *)0x0)) {
                  pcVar7 = "sqlite_master";
                  if (iDb_00 == 1) {
                    pcVar7 = "sqlite_temp_master";
                  }
                  sqlite3NestedParse(pParse,
                                     "UPDATE \"%w\".%s SET sql = sqlite_rename_parent(sql, %Q, %Q) WHERE %s;"
                                     ,pcVar6,pcVar7,zIn,db,pcVar5);
                  sqlite3DbFree(db_00,pcVar5);
                }
                pcVar5 = "sqlite_master";
                if (iDb_00 == 1) {
                  pcVar5 = "sqlite_temp_master";
                }
                sqlite3NestedParse(pParse,
                                   "UPDATE %Q.%s SET sql = CASE WHEN type = \'trigger\' THEN sqlite_rename_trigger(sql, %Q)ELSE sqlite_rename_table(sql, %Q) END, tbl_name = %Q, name = CASE WHEN type=\'table\' THEN %Q WHEN name LIKE \'sqlite_autoindex%%\' AND type=\'index\' THEN \'sqlite_autoindex_\' || %Q || substr(name,%d+18) ELSE name END WHERE tbl_name=%Q COLLATE nocase AND (type=\'table\' OR type=\'index\' OR type=\'trigger\');"
                                   ,pcVar6,pcVar5,db,db,db,db,db,iVar2,zIn);
                pTVar3 = sqlite3FindTable(db_00,"sqlite_sequence",pcVar6);
                if (pTVar3 != (Table *)0x0) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
                                     pcVar6,db,pTable->zName);
                }
                pcVar6 = whereTempTriggers(pParse,pTable);
                if (pcVar6 != (char *)0x0) {
                  sqlite3NestedParse(pParse,
                                     "UPDATE sqlite_temp_master SET sql = sqlite_rename_trigger(sql, %Q), tbl_name = %Q WHERE %s;"
                                     ,db,db,pcVar6);
                  sqlite3DbFree(db_00,pcVar6);
                }
                if ((db_00->flags & 0x40000U) != 0) {
                  for (pFrom = (Table *)sqlite3FkReferences(pTable); pFrom != (Table *)0x0;
                      pFrom = (Table *)pFrom->pSelect) {
                    if ((Table *)pFrom->zName != pTable) {
                      reloadTableSchema(pParse,(Table *)pFrom->zName,((Table *)pFrom->zName)->zName)
                      ;
                    }
                  }
                }
                reloadTableSchema(pParse,pTable,(char *)db);
              }
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"view %s may not be altered",pTable->zName);
          }
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"there is already another table or index with this name: %s",db);
      }
    }
  }
  sqlite3SrcListDelete(db_00,pSrc);
  sqlite3DbFree(db_00,db);
  db_00->flags = iVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameTable(
  Parse *pParse,            /* Parser context. */
  SrcList *pSrc,            /* The table to rename. */
  Token *pName              /* The new table name. */
){
  int iDb;                  /* Database that contains the table */
  char *zDb;                /* Name of database iDb */
  Table *pTab;              /* Table being renamed */
  char *zName = 0;          /* NULL-terminated version of pName */ 
  sqlite3 *db = pParse->db; /* Database connection */
  int nTabName;             /* Number of UTF-8 characters in zTabName */
  const char *zTabName;     /* Original name of the table */
  Vdbe *v;
#ifndef SQLITE_OMIT_TRIGGER
  char *zWhere = 0;         /* Where clause to locate temp triggers */
#endif
  VTable *pVTab = 0;        /* Non-zero if this is a v-tab with an xRename() */
  int savedDbFlags;         /* Saved value of db->flags */

  savedDbFlags = db->flags;  
  if( NEVER(db->mallocFailed) ) goto exit_rename_table;
  assert( pSrc->nSrc==1 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );

  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_table;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  zDb = db->aDb[iDb].zName;
  db->flags |= SQLITE_PreferBuiltin;

  /* Get a NULL terminated version of the new table name. */
  zName = sqlite3NameFromToken(db, pName);
  if( !zName ) goto exit_rename_table;

  /* Check that a table or index named 'zName' does not already exist
  ** in database iDb. If so, this is an error.
  */
  if( sqlite3FindTable(db, zName, zDb) || sqlite3FindIndex(db, zName, zDb) ){
    sqlite3ErrorMsg(pParse, 
        "there is already another table or index with this name: %s", zName);
    goto exit_rename_table;
  }

  /* Make sure it is not a system table being altered, or a reserved name
  ** that the table is being renamed to.
  */
  if( SQLITE_OK!=isSystemTable(pParse, pTab->zName) ){
    goto exit_rename_table;
  }
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){ goto
    exit_rename_table;
  }

#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "view %s may not be altered", pTab->zName);
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_table;
  }
#endif

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_rename_table;
  }
  if( IsVirtual(pTab) ){
    pVTab = sqlite3GetVTable(db, pTab);
    if( pVTab->pVtab->pModule->xRename==0 ){
      pVTab = 0;
    }
  }
#endif

  /* Begin a transaction and code the VerifyCookie for database iDb. 
  ** Then modify the schema cookie (since the ALTER TABLE modifies the
  ** schema). Open a statement transaction if the table is a virtual
  ** table.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto exit_rename_table;
  }
  sqlite3BeginWriteOperation(pParse, pVTab!=0, iDb);
  sqlite3ChangeCookie(pParse, iDb);

  /* If this is a virtual table, invoke the xRename() function if
  ** one is defined. The xRename() callback will modify the names
  ** of any resources used by the v-table implementation (including other
  ** SQLite tables) that are identified by the name of the virtual table.
  */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( pVTab ){
    int i = ++pParse->nMem;
    sqlite3VdbeAddOp4(v, OP_String8, 0, i, 0, zName, 0);
    sqlite3VdbeAddOp4(v, OP_VRename, i, 0, 0,(const char*)pVTab, P4_VTAB);
    sqlite3MayAbort(pParse);
  }
#endif

  /* figure out how many UTF-8 characters are in zName */
  zTabName = pTab->zName;
  nTabName = sqlite3Utf8CharLen(zTabName, -1);

#if !defined(SQLITE_OMIT_FOREIGN_KEY) && !defined(SQLITE_OMIT_TRIGGER)
  if( db->flags&SQLITE_ForeignKeys ){
    /* If foreign-key support is enabled, rewrite the CREATE TABLE 
    ** statements corresponding to all child tables of foreign key constraints
    ** for which the renamed table is the parent table.  */
    if( (zWhere=whereForeignKeys(pParse, pTab))!=0 ){
      sqlite3NestedParse(pParse, 
          "UPDATE \"%w\".%s SET "
              "sql = sqlite_rename_parent(sql, %Q, %Q) "
              "WHERE %s;", zDb, SCHEMA_TABLE(iDb), zTabName, zName, zWhere);
      sqlite3DbFree(db, zWhere);
    }
  }
#endif

  /* Modify the sqlite_master table to use the new table name. */
  sqlite3NestedParse(pParse,
      "UPDATE %Q.%s SET "
#ifdef SQLITE_OMIT_TRIGGER
          "sql = sqlite_rename_table(sql, %Q), "
#else
          "sql = CASE "
            "WHEN type = 'trigger' THEN sqlite_rename_trigger(sql, %Q)"
            "ELSE sqlite_rename_table(sql, %Q) END, "
#endif
          "tbl_name = %Q, "
          "name = CASE "
            "WHEN type='table' THEN %Q "
            "WHEN name LIKE 'sqlite_autoindex%%' AND type='index' THEN "
             "'sqlite_autoindex_' || %Q || substr(name,%d+18) "
            "ELSE name END "
      "WHERE tbl_name=%Q COLLATE nocase AND "
          "(type='table' OR type='index' OR type='trigger');", 
      zDb, SCHEMA_TABLE(iDb), zName, zName, zName, 
#ifndef SQLITE_OMIT_TRIGGER
      zName,
#endif
      zName, nTabName, zTabName
  );

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* If the sqlite_sequence table exists in this database, then update 
  ** it with the new table name.
  */
  if( sqlite3FindTable(db, "sqlite_sequence", zDb) ){
    sqlite3NestedParse(pParse,
        "UPDATE \"%w\".sqlite_sequence set name = %Q WHERE name = %Q",
        zDb, zName, pTab->zName);
  }
#endif

#ifndef SQLITE_OMIT_TRIGGER
  /* If there are TEMP triggers on this table, modify the sqlite_temp_master
  ** table. Don't do this if the table being ALTERed is itself located in
  ** the temp database.
  */
  if( (zWhere=whereTempTriggers(pParse, pTab))!=0 ){
    sqlite3NestedParse(pParse, 
        "UPDATE sqlite_temp_master SET "
            "sql = sqlite_rename_trigger(sql, %Q), "
            "tbl_name = %Q "
            "WHERE %s;", zName, zName, zWhere);
    sqlite3DbFree(db, zWhere);
  }
#endif

#if !defined(SQLITE_OMIT_FOREIGN_KEY) && !defined(SQLITE_OMIT_TRIGGER)
  if( db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Table *pFrom = p->pFrom;
      if( pFrom!=pTab ){
        reloadTableSchema(pParse, p->pFrom, pFrom->zName);
      }
    }
  }
#endif

  /* Drop and reload the internal table schema. */
  reloadTableSchema(pParse, pTab, zName);

exit_rename_table:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zName);
  db->flags = savedDbFlags;
}